

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_x11.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  ATimeUs AVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  uint uVar6;
  char *pcVar7;
  EGLConfig config;
  ATimeUs local_180;
  EGLint num_config;
  EGLint ver_maj;
  EGLint ver_min;
  Atom delete_message;
  XSetWindowAttributes winattrs;
  XVisualInfo xvisual_info;
  
  AVar2 = aAppTime();
  a__x11_0 = XOpenDisplay(0);
  if (a__x11_0 == 0) {
    pcVar7 = "a__x11.display = XOpenDisplay(NULL)";
    uVar4 = 0xff;
  }
  else {
    eglBindAPI(0x30a2);
    a_app_egl_display = (EGLDisplay)eglGetDisplay(a__x11_0);
    if (a_app_egl_display == (EGLDisplay)0x0) {
      pcVar7 = "EGL_NO_DISPLAY != (a_app_egl_display = eglGetDisplay(a__x11.display))";
      uVar4 = 0x10e;
    }
    else {
      iVar3 = eglInitialize(a_app_egl_display,&ver_maj,&ver_min);
      if (iVar3 == 0) {
        pcVar7 = "eglInitialize(a_app_egl_display, &ver_maj, &ver_min)";
        uVar4 = 0x10f;
      }
      else {
        aAppDebugPrintf("EGL: version %d.%d",(ulong)(uint)ver_maj,(ulong)(uint)ver_min);
        uVar4 = eglQueryString(a_app_egl_display,0x3054);
        aAppDebugPrintf("EGL: EGL_VERSION: \'%s\'",uVar4);
        uVar4 = eglQueryString(a_app_egl_display,0x3053);
        aAppDebugPrintf("EGL: EGL_VENDOR: \'%s\'",uVar4);
        uVar4 = eglQueryString(a_app_egl_display,0x308d);
        aAppDebugPrintf("EGL: EGL_CLIENT_APIS: \'%s\'",uVar4);
        uVar4 = eglQueryString(a_app_egl_display,0x3055);
        aAppDebugPrintf("EGL: EGL_EXTENSIONS: \'%s\'",uVar4);
        iVar3 = eglChooseConfig(a_app_egl_display,a__app_egl_config_attrs,&config,1,&num_config);
        if (iVar3 == 0) {
          pcVar7 = 
          "eglChooseConfig(a_app_egl_display, a__app_egl_config_attrs, &config, 1, &num_config)";
          uVar4 = 0x11c;
        }
        else if (num_config < 1) {
          pcVar7 = "num_config > 0";
          uVar4 = 0x11e;
        }
        else {
          xvisual_info.blue_mask = 0;
          xvisual_info.colormap_size = 0;
          xvisual_info.bits_per_rgb = 0;
          xvisual_info.red_mask = 0;
          xvisual_info.green_mask = 0;
          xvisual_info.screen = 0;
          xvisual_info.depth = 0;
          xvisual_info.class = 0;
          xvisual_info._28_4_ = 0;
          xvisual_info.visual = (Visual *)0x0;
          xvisual_info.visualid = 0;
          iVar3 = eglGetConfigAttrib(a_app_egl_display,config,0x302e);
          if (iVar3 == 0) {
            pcVar7 = 
            "eglGetConfigAttrib(a_app_egl_display, config, EGL_NATIVE_VISUAL_ID, (EGLint*)&xvisual_info.visualid)"
            ;
            uVar4 = 0x123;
          }
          else {
            puVar5 = (undefined8 *)XGetVisualInfo(a__x11_0,3,&xvisual_info,&winattrs);
            if (puVar5 == (undefined8 *)0x0) {
              pcVar7 = 
              "vinfo = XGetVisualInfo(a__x11.display, VisualScreenMask | VisualIDMask, &xvisual_info, &num_visuals)"
              ;
              uVar4 = 0x126;
            }
            else {
              winattrs.save_under = 0;
              winattrs._68_4_ = 0;
              winattrs.border_pixmap = 0;
              winattrs.backing_store = 0;
              winattrs._44_4_ = 0;
              winattrs.background_pixmap = 0;
              winattrs.background_pixel = 0;
              winattrs.backing_planes = 0;
              winattrs.backing_pixel = 0;
              winattrs.do_not_propagate_mask = 0;
              winattrs.override_redirect = 0;
              winattrs._92_4_ = 0;
              winattrs.colormap = 0;
              winattrs.cursor = 0;
              winattrs.event_mask = 0x3804f;
              winattrs.border_pixel = 0;
              winattrs.bit_gravity = 10;
              winattrs.win_gravity = 0;
              winattrs.colormap =
                   XCreateColormap(a__x11_0,*(undefined8 *)
                                             (*(long *)(a__x11_0 + 0xe8) + 0x10 +
                                             (long)*(int *)(puVar5 + 2) * 0x80),*puVar5,0);
              winattrs._88_8_ = winattrs._88_8_ & 0xffffffff00000000;
              a__x11_1 = XCreateWindow(a__x11_0,*(undefined8 *)
                                                 (*(long *)(a__x11_0 + 0xe8) + 0x10 +
                                                 (long)*(int *)(puVar5 + 2) * 0x80),0,0,0x500,0x2d0,
                                       0,*(undefined4 *)((long)puVar5 + 0x14),1,*puVar5,0x2818,
                                       &winattrs);
              if (a__x11_1 == 0) {
                pcVar7 = "a__x11.window";
                uVar4 = 0x136;
              }
              else {
                XStoreName(a__x11_0,a__x11_1,"atto app");
                delete_message = XInternAtom(a__x11_0,"WM_DELETE_WINDOW",1);
                XSetWMProtocols(a__x11_0,a__x11_1,&delete_message,1);
                XMapWindow(a__x11_0,a__x11_1);
                XkbSetDetectableAutoRepeat(a__x11_0,1,0);
                a__app_egl_0 = eglCreateContext(a_app_egl_display,config,0,a__app_egl_context_attrs)
                ;
                if (a__app_egl_0 == 0) {
                  pcVar7 = "EGL_NO_CONTEXT != a__app_egl.context";
                  uVar4 = 0x149;
                }
                else {
                  a__app_egl_1 = eglCreateWindowSurface(a_app_egl_display,config,a__x11_1,0);
                  if (a__app_egl_1 == 0) {
                    pcVar7 = "EGL_NO_SURFACE != a__app_egl.surface";
                    uVar4 = 0x14d;
                  }
                  else {
                    iVar3 = eglMakeCurrent(a_app_egl_display,a__app_egl_1,a__app_egl_1,a__app_egl_0)
                    ;
                    if (iVar3 == 0) {
                      pcVar7 = 
                      "eglMakeCurrent(a_app_egl_display, a__app_egl.surface, a__app_egl.surface, a__app_egl.context)"
                      ;
                      uVar4 = 0x150;
                    }
                    else {
                      XSelectInput(a__x11_0,a__x11_1,0x2004f);
                      a__app_state.gl_version = AOGLV_21;
                      a__app_state.width = 0x500;
                      a__app_state.height = 0x2d0;
                      a__app_state.argc = argc;
                      a__app_state.argv = argv;
                      attoAppInit(&a__app_proctable);
                      if (a__app_proctable.resize != (_func_void_ATimeUs_uint_uint *)0x0) {
                        (*a__app_proctable.resize)(AVar2,0,0);
                      }
                      AVar2 = 0;
                      do {
                        while (local_180 = AVar2, iVar3 = XPending(a__x11_0), iVar3 != 0) {
                          XNextEvent(a__x11_0,&xvisual_info);
                          uVar6 = a__app_state.height;
                          iVar3 = 7;
                          if ((int)xvisual_info.visual - 2U < 0x11) {
                            iVar3 = (*(code *)(&DAT_001064f0 +
                                              *(int *)(&DAT_001064f0 +
                                                      (ulong)((int)xvisual_info.visual - 2U) * 4)))
                                              ();
                            return iVar3;
                          }
                          if ((int)xvisual_info.visual != 0x21) {
                            if ((int)xvisual_info.visual == 0x16) {
                              uVar1 = a__app_state.width;
                              if (a__app_state.height != xvisual_info.bits_per_rgb ||
                                  a__app_state.width != xvisual_info.colormap_size) {
                                a__app_state.width = xvisual_info.colormap_size;
                                a__app_state.height = xvisual_info.bits_per_rgb;
                                AVar2 = aAppTime();
                                if (a__app_proctable.resize != (_func_void_ATimeUs_uint_uint *)0x0)
                                {
                                  (*a__app_proctable.resize)(AVar2,uVar1,uVar6);
                                }
                              }
                            }
                            iVar3 = 0;
                          }
                          AVar2 = local_180;
                          if (iVar3 != 0) {
                            if (iVar3 == 7) {
                              if (a__app_proctable.close != (_func_void *)0x0) {
                                (*a__app_proctable.close)();
                              }
                              aAppDebugPrintf("cleaning up");
                              if (a_app_egl_display == (EGLDisplay)0x0) {
                                pcVar7 = "a_app_egl_display != EGL_NO_DISPLAY";
                                uVar4 = 0x19d;
                                goto LAB_00105ec5;
                              }
                              eglTerminate();
                              XDestroyWindow(a__x11_0,a__x11_1);
                              XCloseDisplay(a__x11_0);
                            }
                            return 0;
                          }
                        }
                        AVar2 = aAppTime();
                        if (a__app_proctable.paint != (_func_void_ATimeUs_float *)0x0) {
                          uVar6 = AVar2 - local_180;
                          if (local_180 == 0) {
                            uVar6 = 0;
                          }
                          (*a__app_proctable.paint)(AVar2,(float)uVar6 * 1e-06);
                        }
                        iVar3 = eglSwapBuffers(a_app_egl_display,a__app_egl_1);
                      } while (iVar3 != 0);
                      pcVar7 = "eglSwapBuffers(a_app_egl_display, a__app_egl.surface)";
                      uVar4 = 0x18d;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00105ec5:
  aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                  "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",uVar4
                  ,pcVar7);
  exit(-1);
}

Assistant:

int main(int argc, char *argv[]) {
	ATimeUs timestamp = aAppTime();
	XSetWindowAttributes winattrs;
	Atom delete_message;
#ifndef ATTO_EGL
	int nglxconfigs = 0;
	GLXFBConfig *glxconfigs = NULL;
#endif
	XVisualInfo *vinfo = NULL;
	ATimeUs last_paint = 0;

	ATTO_ASSERT(a__x11.display = XOpenDisplay(NULL));

#ifndef ATTO_EGL
	ATTO_ASSERT(glxconfigs = glXChooseFBConfig(a__x11.display, 0, a__glxattribs, &nglxconfigs));
	ATTO_ASSERT(nglxconfigs);

	ATTO_ASSERT(vinfo = glXGetVisualFromFBConfig(a__x11.display, glxconfigs[0]));

#else
	EGLint ver_min, ver_maj;
	EGLConfig config;
	EGLint num_config;

	eglBindAPI(EGL_OPENGL_API);

	ATTO_ASSERT(EGL_NO_DISPLAY != (a_app_egl_display = eglGetDisplay(a__x11.display)));
	ATTO_ASSERT(eglInitialize(a_app_egl_display, &ver_maj, &ver_min));

	aAppDebugPrintf("EGL: version %d.%d", ver_maj, ver_min);
	aAppDebugPrintf("EGL: EGL_VERSION: '%s'",
		eglQueryString(a_app_egl_display, EGL_VERSION));
	aAppDebugPrintf("EGL: EGL_VENDOR: '%s'",
		eglQueryString(a_app_egl_display, EGL_VENDOR));
	aAppDebugPrintf("EGL: EGL_CLIENT_APIS: '%s'",
		eglQueryString(a_app_egl_display, EGL_CLIENT_APIS));
	aAppDebugPrintf("EGL: EGL_EXTENSIONS: '%s'",
		eglQueryString(a_app_egl_display, EGL_EXTENSIONS));

	ATTO_ASSERT(eglChooseConfig(a_app_egl_display, a__app_egl_config_attrs,
		&config, 1, &num_config));

	ATTO_ASSERT(num_config > 0);

	{
		XVisualInfo xvisual_info = {0};
		int num_visuals;
		ATTO_ASSERT(eglGetConfigAttrib(a_app_egl_display, config, EGL_NATIVE_VISUAL_ID, (EGLint*)&xvisual_info.visualid));
		//xvisual_info.screen = DefaultScreen(a__x11.display);

		ATTO_ASSERT(vinfo = XGetVisualInfo(a__x11.display, VisualScreenMask | VisualIDMask, &xvisual_info, &num_visuals));
	}
#endif // ATTO_EGL

	memset(&winattrs, 0, sizeof(winattrs));
	winattrs.event_mask = KeyPressMask | KeyReleaseMask | ButtonPressMask | ButtonReleaseMask | PointerMotionMask |
		ExposureMask | VisibilityChangeMask | StructureNotifyMask;
	winattrs.border_pixel = 0;
	winattrs.bit_gravity = StaticGravity;
	winattrs.colormap =
		XCreateColormap(a__x11.display, RootWindow(a__x11.display, vinfo->screen), vinfo->visual, AllocNone);
	winattrs.override_redirect = False;

	a__x11.window =
		XCreateWindow(a__x11.display, RootWindow(a__x11.display, vinfo->screen), 0, 0, ATTO_APP_WIDTH, ATTO_APP_HEIGHT, 0,
			vinfo->depth, InputOutput, vinfo->visual, CWBorderPixel | CWBitGravity | CWEventMask | CWColormap, &winattrs);
	ATTO_ASSERT(a__x11.window);

	XStoreName(a__x11.display, a__x11.window, ATTO_APP_NAME);

	delete_message = XInternAtom(a__x11.display, "WM_DELETE_WINDOW", True);
	XSetWMProtocols(a__x11.display, a__x11.window, &delete_message, 1);

	XMapWindow(a__x11.display, a__x11.window);

	XkbSetDetectableAutoRepeat(a__x11.display, True, NULL);

#ifndef ATTO_EGL
	ATTO_ASSERT(a__x11.context = glXCreateNewContext(a__x11.display, glxconfigs[0], GLX_RGBA_TYPE, 0, True));
	ATTO_ASSERT(a__x11.drawable = glXCreateWindow(a__x11.display, glxconfigs[0], a__x11.window, 0));

	glXMakeContextCurrent(a__x11.display, a__x11.drawable, a__x11.drawable, a__x11.context);
#else
	a__app_egl.context = eglCreateContext(a_app_egl_display, config,
		EGL_NO_CONTEXT, a__app_egl_context_attrs);
	ATTO_ASSERT(EGL_NO_CONTEXT != a__app_egl.context);

	a__app_egl.surface = eglCreateWindowSurface(a_app_egl_display, config, a__x11.window, 0);
	//a__app_egl.surface = eglCreatePlatformWindowSurface(a_app_egl_display, config, &native_window, 0);
	ATTO_ASSERT(EGL_NO_SURFACE != a__app_egl.surface);

	ATTO_ASSERT(eglMakeCurrent(a_app_egl_display, a__app_egl.surface,
		a__app_egl.surface, a__app_egl.context));
#endif // !ATTO_EGL

	XSelectInput(a__x11.display, a__x11.window,
		StructureNotifyMask | KeyPressMask | KeyReleaseMask | ButtonPressMask | ButtonReleaseMask | PointerMotionMask);
	a__app_state.argc = argc;
	a__app_state.argv = (const char *const *)argv;
	a__app_state.gl_version = AOGLV_21;
	a__app_state.width = ATTO_APP_WIDTH;
	a__app_state.height = ATTO_APP_HEIGHT;

	ATTO_APP_INIT_FUNC(&a__app_proctable);

	if (a__app_proctable.resize)
		a__app_proctable.resize(timestamp, 0, 0);

	for (;;) {
		while (XPending(a__x11.display)) {
			XEvent e;
			XNextEvent(a__x11.display, &e);
			switch (e.type) {
			case ConfigureNotify: {
				unsigned int oldw = a__app_state.width, oldh = a__app_state.height;

				if (a__app_state.width == (unsigned int)e.xconfigure.width &&
					a__app_state.height == (unsigned int)e.xconfigure.height)
					break;

				a__app_state.width = e.xconfigure.width;
				a__app_state.height = e.xconfigure.height;
				timestamp = aAppTime();

				if (a__app_proctable.resize)
					a__app_proctable.resize(timestamp, oldw, oldh);
			} break;

			case ButtonPress:
			case ButtonRelease: a__appProcessXButton(&e); break;
			case MotionNotify: a__appProcessXMotion(&e); break;
			case KeyPress:
			case KeyRelease: a__appProcessXKeyEvent(&e); break;

			case ClientMessage:
			case DestroyNotify:
			case UnmapNotify: goto exit; break;
			}
		}

		{
			ATimeUs now = aAppTime();
			float dt;
			if (!last_paint)
				last_paint = now;
			dt = (now - last_paint) * 1e-6f;

			if (a__app_proctable.paint)
				a__app_proctable.paint(now, dt);

#ifndef ATTO_EGL
			glXSwapBuffers(a__x11.display, a__x11.drawable);
#else
			ATTO_ASSERT(eglSwapBuffers(a_app_egl_display, a__app_egl.surface));
#endif
			last_paint = now;
		}
	}

exit:
	if (a__app_proctable.close)
		a__app_proctable.close();

	aAppDebugPrintf("cleaning up");
#ifndef ATTO_EGL
	glXMakeContextCurrent(a__x11.display, 0, 0, 0);
	glXDestroyWindow(a__x11.display, a__x11.drawable);
	glXDestroyContext(a__x11.display, a__x11.context);
#else
	ATTO_ASSERT(a_app_egl_display != EGL_NO_DISPLAY);
	eglTerminate(a_app_egl_display);
#endif
	XDestroyWindow(a__x11.display, a__x11.window);
	XCloseDisplay(a__x11.display);

	return 0;
}